

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O2

int rtr_undo_update_pfx_table_batch
              (rtr_socket *rtr_socket,pfx_table *pfx_table,pdu_ipv4 *ipv4_pdus,size_t ipv4_pdu_count
              ,pdu_ipv6 *ipv6_pdus,size_t ipv6_pdu_count)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = ipv4_pdu_count + 1;
  do {
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      lVar3 = 1;
      goto LAB_0010b836;
    }
    iVar2 = rtr_undo_update_pfx_table(rtr_socket,pfx_table,ipv4_pdus);
    ipv4_pdus = ipv4_pdus + 1;
  } while (iVar2 != -1);
  lrtr_dbg(
          "RTR Socket: Couldn\'t undo all update operations from failed data synchronisation: Purging all prefix records"
          );
  pfx_table_src_remove(pfx_table,rtr_socket);
  iVar2 = -1;
  goto LAB_0010b881;
  while( true ) {
    iVar2 = rtr_undo_update_pfx_table(rtr_socket,pfx_table,ipv6_pdus);
    lVar3 = lVar3 + -1;
    ipv6_pdus = ipv6_pdus + 1;
    if (iVar2 == -1) break;
LAB_0010b836:
    if (ipv6_pdu_count + lVar3 == 1) {
      iVar2 = 0;
      goto LAB_0010b881;
    }
  }
  lrtr_dbg(
          "RTR Socket: Couldn\'t undo all update operations from failed data synchronisation: Purging all prefix records"
          );
  pfx_table_src_remove(pfx_table,rtr_socket);
  iVar2 = -(uint)((ulong)-lVar3 < ipv6_pdu_count);
LAB_0010b881:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_undo_update_pfx_table_batch(struct rtr_socket *rtr_socket, struct pfx_table *pfx_table,
					   struct pdu_ipv4 *ipv4_pdus, size_t ipv4_pdu_count,
					   struct pdu_ipv6 *ipv6_pdus, size_t ipv6_pdu_count)
{
	for (size_t i = 0; i < ipv4_pdu_count; i++) {
		int res = rtr_undo_update_pfx_table(rtr_socket, pfx_table, &(ipv4_pdus[i]));

		if (res == RTR_ERROR || res == PFX_ERROR) {
			// Undo failed, cannot recover, remove all records associated with the socket instead
			RTR_DBG1(
				"Couldn't undo all update operations from failed data synchronisation: Purging all prefix records");
			pfx_table_src_remove(pfx_table, rtr_socket);
			return RTR_ERROR;
		}
	}

	for (size_t i = 0; i < ipv6_pdu_count; i++) {
		int res = rtr_undo_update_pfx_table(rtr_socket, pfx_table, &(ipv6_pdus[i]));

		if (res == RTR_ERROR || res == PFX_ERROR) {
			// Undo failed, cannot recover, remove all records associated with the socket instead
			RTR_DBG1(
				"Couldn't undo all update operations from failed data synchronisation: Purging all prefix records");
			pfx_table_src_remove(pfx_table, rtr_socket);
			return RTR_ERROR;
		}
	}
	return RTR_SUCCESS;
}